

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::TeamCityReporter::testGroupStarting(TeamCityReporter *this,GroupInfo *groupInfo)

{
  char *pcVar1;
  pointer pcVar2;
  size_t sVar3;
  ostream *poVar4;
  string local_38;
  
  Option<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>);
  pcVar1 = (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
           storage;
  *(char **)(this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
            storage =
       (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.storage +
       0x10;
  pcVar2 = (groupInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pcVar1,pcVar2,pcVar2 + (groupInfo->name)._M_string_length);
  sVar3 = groupInfo->groupsCounts;
  *(size_t *)
   ((this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.storage +
   0x20) = groupInfo->groupIndex;
  *(size_t *)
   ((this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.storage +
   0x28) = sVar3;
  (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.nullableValue
       = (GroupInfo *)pcVar1;
  (this->super_StreamingReporterBase).currentGroupInfo.used = false;
  poVar4 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"##teamcity[testSuiteStarted name=\'",0x22);
  anon_unknown_23::escape(&local_38,&groupInfo->name);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\']\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TeamCityReporter::testGroupStarting(GroupInfo const &groupInfo) {
        StreamingReporterBase::testGroupStarting(groupInfo);
        stream << "##teamcity[testSuiteStarted name='"
            << escape(groupInfo.name) << "']\n";
    }